

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_fff2c7::HandleRemoveExtensionCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  offset_in_SetProviderArgs_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  in_RCX;
  pointer pbVar6;
  static_string_view name;
  string_view value;
  string inputPath;
  cmCMakePath path;
  Arguments arguments;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  long local_148 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  _Any_data _Stack_f0;
  undefined1 auStack_e0 [16];
  _Any_data _Stack_d0;
  pointer ppStack_c0;
  bool local_b8;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  size_t local_68;
  string local_60;
  char local_40;
  char local_38;
  ArgumentParserWithOutputVariable<Arguments> *pAVar5;
  
  if ((anonymous_namespace)::
      HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar4 != 0) {
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
                ((ArgumentParserWithOutputVariable<Arguments> *)local_118);
      name.super_string_view._M_str = "LAST_ONLY";
      name.super_string_view._M_len = 9;
      pAVar5 = (ArgumentParserWithOutputVariable<Arguments> *)0x9;
      ArgumentParserWithOutputVariable<Arguments>::Bind<bool>
                ((ArgumentParserWithOutputVariable<Arguments> *)local_118,name,in_RCX);
      ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
                ((ArgumentParserWithOutputVariable<Arguments> *)local_118,pAVar5);
      CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser
                ((CMakePathArgumentParser<Arguments> *)local_118);
      __cxa_atexit(CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser,
                   &HandleRemoveExtensionCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleRemoveExtensionCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&HandleRemoveExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.
                     Inputs,HandleRemoveExtensionCommand::parser.
                            super_CMakePathArgumentParser<Arguments>.Inputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  local_178._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_178._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 2;
  local_78 = (_Base_ptr)(local_90 + 8);
  local_90._8_4_ = _S_red;
  local_80 = (_Base_ptr)0x0;
  local_68 = 0;
  local_40 = '\0';
  local_38 = '\0';
  local_118._0_8_ = &HandleRemoveExtensionCommand::parser;
  local_118._8_8_ = local_90;
  local_108._0_8_ =
       &HandleRemoveExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs;
  local_108._16_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  _Stack_f0._M_unused._M_object = (char *)0x0;
  _Stack_f0._8_8_ = 0;
  auStack_e0._0_8_ = (_Manager_type)0x0;
  auStack_e0._8_8_ = 0;
  _Stack_d0._0_8_ = 0;
  _Stack_d0._8_8_ = (_Manager_type)0x0;
  ppStack_c0 = (pointer)0x0;
  local_b8 = false;
  local_108._8_8_ = local_118._8_8_;
  local_70 = local_78;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_118,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_178,0);
  if ((_Manager_type)_Stack_d0._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_d0._8_8_)(auStack_e0 + 8,auStack_e0 + 8,3);
  }
  bVar2 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_90,status->Makefile);
  bVar3 = true;
  if (!bVar2) {
    if (HandleRemoveExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        HandleRemoveExtensionCommand::parser.super_CMakePathArgumentParser<Arguments>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_178._8_8_ = (pointer)0x0;
      local_178[0x10] = '\0';
      local_178._0_8_ = (pointer)(local_178 + 0x10);
      bVar3 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,(string *)local_178
                          );
      if (bVar3) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_178._0_8_,
                   (undefined1 *)
                   ((long)&((_Alloc_hider *)local_178._8_8_)->_M_p +
                   (long)&((_Alloc_hider *)local_178._0_8_)->_M_p));
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_118,&local_138,generic_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if (local_38 == '\x01') {
          cmCMakePath::RemoveExtension((cmCMakePath *)local_118);
        }
        else {
          cmCMakePath::RemoveWideExtension((cmCMakePath *)local_118);
        }
        cVar1 = local_40;
        this = status->Makefile;
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_158._M_allocated_capacity = (size_type)local_148;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,local_118._0_8_,
                   (pointer)(local_118._0_8_ +
                            (long)(map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_118._8_8_));
        pbVar6 = pbVar6 + 1;
        if (cVar1 != '\0') {
          pbVar6 = &local_60;
        }
        value._M_str = (char *)local_158._M_allocated_capacity;
        value._M_len = local_158._8_8_;
        cmMakefile::AddDefinition(this,pbVar6,value);
        if ((long *)local_158._M_allocated_capacity != local_148) {
          operator_delete((void *)local_158._M_allocated_capacity,local_148[0] + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_118);
      }
      if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,CONCAT71(local_178._17_7_,local_178[0x10]) + 1);
      }
    }
    else {
      local_118._0_8_ = (ActionMap *)local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"REMOVE_EXTENSION called with unexpected arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((ActionMap *)local_118._0_8_ != (ActionMap *)local_108) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
      }
      bVar3 = false;
    }
  }
  if (local_40 == '\x01') {
    local_40 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
  return bVar3;
}

Assistant:

bool HandleRemoveExtensionCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    bool LastOnly = false;
  };

  static auto const parser =
    ArgumentParserWithOutputVariable<Arguments>{}.Bind("LAST_ONLY"_s,
                                                       &Arguments::LastOnly);

  Arguments const arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError("REMOVE_EXTENSION called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);

  if (arguments.LastOnly) {
    path.RemoveExtension();
  } else {
    path.RemoveWideExtension();
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}